

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QToolBarAreaLayoutItem>::removeAt(QList<QToolBarAreaLayoutItem> *this,qsizetype i)

{
  char *in_RSI;
  QList<QToolBarAreaLayoutItem> *in_RDI;
  
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }